

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<std::pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>const,std::__cxx11::string_const&,std::__cxx11::string_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>const,std::__cxx11::string_const&,std::__cxx11::string_const*>>,std::pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>const,std::__cxx11::string_const&,std::__cxx11::string_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>const,std::__cxx11::string_const&,std::__cxx11::string_const*>>>
          (string *__return_storage_ptr__,internal *this,
          pair<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          *value,pair<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *param_2)

{
  string *psVar1;
  stringstream ss;
  char local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a1 = '(';
  std::__ostream_insert<char,std::char_traits<char>>(local_190,&local_1a1,1);
  PrintBytesInObjectTo((uchar *)this,0x10,local_190);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,", ",2);
  PrintBytesInObjectTo((uchar *)(this + 0x10),0x10,local_190);
  local_1a1 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(local_190,&local_1a1,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  psVar1 = (string *)std::ios_base::~ios_base(local_120);
  return psVar1;
}

Assistant:

std::string FormatForComparisonFailureMessage(const T1& value,
                                              const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}